

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O3

UBool ucstrTextAccess(UText *ut,int64_t index,UBool forward)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  
  if (index < 0) {
    lVar4 = 0;
  }
  else {
    pvVar1 = ut->context;
    uVar7 = ut->chunkNativeLimit;
    lVar4 = index;
    if (index < (long)uVar7) {
      if ((index != 0) && ((*(ushort *)((long)pvVar1 + index * 2) & 0xfc00) == 0xdc00)) {
        lVar4 = index - (ulong)((*(ushort *)((long)pvVar1 + index * 2 + -2) & 0xfc00) == 0xd800);
      }
    }
    else {
      lVar4 = ut->a;
      if (ut->a < 0) {
        uVar3 = 0x7fffffff;
        if ((ulong)index < 0x7fffffe0) {
          uVar3 = (int)index + 0x20;
        }
        if ((int)uVar7 < (int)uVar3) {
          lVar6 = (long)(int)uVar7;
          do {
            if (*(short *)((long)pvVar1 + lVar6 * 2) == 0) {
              ut->a = lVar6;
              ut->chunkLength = (int32_t)lVar6;
              ut->nativeIndexingLimit = (int32_t)lVar6;
              lVar4 = lVar6;
              if (((index < lVar6) && (lVar4 = index, index != 0)) &&
                 ((*(ushort *)((long)pvVar1 + index * 2) & 0xfc00) == 0xdc00)) {
                lVar4 = index - (ulong)((*(ushort *)((long)pvVar1 + index * 2 + -2) & 0xfc00) ==
                                       0xd800);
              }
              ut->chunkNativeLimit = lVar6;
              goto LAB_0018f713;
            }
            lVar6 = lVar6 + 1;
          } while ((int)uVar3 != lVar6);
          uVar7 = (ulong)uVar3;
        }
        lVar4 = index;
        if ((index != 0) && ((*(ushort *)((long)pvVar1 + index * 2) & 0xfc00) == 0xdc00)) {
          lVar4 = index - (ulong)((*(ushort *)((long)pvVar1 + index * 2 + -2) & 0xfc00) == 0xd800);
        }
        iVar5 = (int)uVar7;
        if (iVar5 == 0x7fffffff) {
          ut->a = 0x7fffffff;
          ut->chunkLength = 0x7fffffff;
          ut->nativeIndexingLimit = 0x7fffffff;
          if (0x7ffffffe < lVar4) {
            lVar4 = 0x7fffffff;
          }
          ut->chunkNativeLimit = 0x7fffffff;
LAB_0018f713:
          *(byte *)&ut->providerProperties = (byte)ut->providerProperties & 0xfd;
        }
        else {
          iVar5 = iVar5 - (uint)((*(ushort *)((long)pvVar1 + (long)iVar5 * 2 + -2) & 0xfc00) ==
                                0xd800);
          ut->chunkNativeLimit = (long)iVar5;
          ut->nativeIndexingLimit = iVar5;
          ut->chunkLength = iVar5;
        }
      }
    }
  }
  ut->chunkOffset = (int32_t)lVar4;
  if ((forward == '\0') || (bVar2 = true, ut->chunkNativeLimit <= lVar4)) {
    bVar2 = 0 < lVar4 && forward == '\0';
  }
  return bVar2;
}

Assistant:

static UBool U_CALLCONV
ucstrTextAccess(UText *ut, int64_t index, UBool  forward) {
    const UChar *str   = (const UChar *)ut->context;

    // pin the requested index to the bounds of the string,
    //  and set current iteration position.
    if (index<0) {
        index = 0;
    } else if (index < ut->chunkNativeLimit) {
        // The request data is within the chunk as it is known so far.
        // Put index on a code point boundary.
        U16_SET_CP_START(str, 0, index);
    } else if (ut->a >= 0) {
        // We know the length of this string, and the user is requesting something
        // at or beyond the length.  Pin the requested index to the length.
        index = ut->a;
    } else {
        // Null terminated string, length not yet known, and the requested index
        //  is beyond where we have scanned so far.
        //  Scan to 32 UChars beyond the requested index.  The strategy here is
        //  to avoid fully scanning a long string when the caller only wants to
        //  see a few characters at its beginning.
        int32_t scanLimit = (int32_t)index + 32;
        if ((index + 32)>INT32_MAX || (index + 32)<0 ) {   // note: int64 expression
            scanLimit = INT32_MAX;
        }

        int32_t chunkLimit = (int32_t)ut->chunkNativeLimit;
        for (; chunkLimit<scanLimit; chunkLimit++) {
            if (str[chunkLimit] == 0) {
                // We found the end of the string.  Remember it, pin the requested index to it,
                //  and bail out of here.
                ut->a = chunkLimit;
                ut->chunkLength = chunkLimit;
                ut->nativeIndexingLimit = chunkLimit;
                if (index >= chunkLimit) {
                    index = chunkLimit;
                } else {
                    U16_SET_CP_START(str, 0, index);
                }

                ut->chunkNativeLimit = chunkLimit;
                ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
                goto breakout;
            }
        }
        // We scanned through the next batch of UChars without finding the end.
        U16_SET_CP_START(str, 0, index);
        if (chunkLimit == INT32_MAX) {
            // Scanned to the limit of a 32 bit length.
            // Forceably trim the overlength string back so length fits in int32
            //  TODO:  add support for 64 bit strings.
            ut->a = chunkLimit;
            ut->chunkLength = chunkLimit;
            ut->nativeIndexingLimit = chunkLimit;
            if (index > chunkLimit) {
                index = chunkLimit;
            }
            ut->chunkNativeLimit = chunkLimit;
            ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
        } else {
            // The endpoint of a chunk must not be left in the middle of a surrogate pair.
            // If the current end is on a lead surrogate, back the end up by one.
            // It doesn't matter if the end char happens to be an unpaired surrogate,
            //    and it's simpler not to worry about it.
            if (U16_IS_LEAD(str[chunkLimit-1])) {
                --chunkLimit;
            }
            // Null-terminated chunk with end still unknown.
            // Update the chunk length to reflect what has been scanned thus far.
            // That the full length is still unknown is (still) flagged by
            //    ut->a being < 0.
            ut->chunkNativeLimit = chunkLimit;
            ut->nativeIndexingLimit = chunkLimit;
            ut->chunkLength = chunkLimit;
        }

    }
breakout:
    U_ASSERT(index<=INT32_MAX);
    ut->chunkOffset = (int32_t)index;

    // Check whether request is at the start or end
    UBool retVal = (forward && index<ut->chunkNativeLimit) || (!forward && index>0);
    return retVal;
}